

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

void __thiscall HandleManager::HandleManager(HandleManager *this)

{
  Mutex *pMVar1;
  MutexFactory *in_RDI;
  
  in_RDI->_vptr_MutexFactory = (_func_int **)&PTR__HandleManager_00223868;
  std::
  map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
  ::map((map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
         *)0x1cbf3b);
  std::
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::map((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
         *)0x1cbf4e);
  MutexFactory::i();
  pMVar1 = MutexFactory::getMutex(in_RDI);
  in_RDI->createMutex = (CK_CREATEMUTEX)pMVar1;
  in_RDI[2].destroyMutex = (CK_DESTROYMUTEX)0x0;
  return;
}

Assistant:

HandleManager::HandleManager()
{
	handlesMutex = MutexFactory::i()->getMutex();
	handleCounter = 0;
}